

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O0

void __thiscall
Arena_BigAndOverflow_Test::~Arena_BigAndOverflow_Test(Arena_BigAndOverflow_Test *this)

{
  Arena_BigAndOverflow_Test *this_local;
  
  ~Arena_BigAndOverflow_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Arena, BigAndOverflow) {
  memt::Arena arena;
  // aligning size causes overflow
  ASSERT_THROW(arena.alloc(static_cast<size_t>(-1)), std::bad_alloc);

  // 2x size is an overflow
  ASSERT_THROW(arena.alloc(static_cast<size_t>(-1)/2 + 1), std::bad_alloc);

  // causes attempt at allocating almost the entire virtual memory space
  // which cannot succeed
  ASSERT_THROW(arena.alloc(static_cast<size_t>(-1)/2 - 100), std::bad_alloc);

  // sizeof(long) * x overflows to a smaller value (0).
  const size_t smallerOverflow = 1ul << (8*sizeof(long) - 1);
  MEMT_ASSERT(smallerOverflow > 0);
  //ASSERT(smallerOverflow * sizeof(long) == 0); compiler warning
  ASSERT_THROW(arena.allocArray<long>(smallerOverflow), std::bad_alloc);

  // sizeof(int) * x overflows to a greater value
  const size_t greaterOverflow = (~(0ul)) >> 1;
  MEMT_ASSERT(sizeof(long) >= 4);
  //ASSERT(greaterOverflow * sizeof(long) > greaterOverflow); compiler warning
  //ASSERT(greaterOverflow != (greaterOverflow * sizeof(long)) / sizeof(long));
  ASSERT_THROW(arena.allocArray<long>(greaterOverflow), std::bad_alloc);

  ASSERT_TRUE(arena.isEmpty());
}